

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_set_option_description(void)

{
  int iVar1;
  undefined4 local_2c;
  cargo_t pcStack_28;
  int a;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&stack0xffffffffffffffd8,0,"program");
  if (iVar1 == 0) {
    local_2c = 0;
    cargo._4_4_ = cargo_add_option(pcStack_28,0,"--alpha","an option","b",&local_2c);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_set_option_description(pcStack_28,"--alpha","%s world %d","hello",0x7b);
      if (cargo._4_4_ == 0) {
        cargo_print_usage(pcStack_28,CARGO_USAGE_FULL);
      }
      else {
        pcStack_18 = "Failed to set description";
      }
    }
    else {
      pcStack_18 = "Failed to create option";
    }
    cargo_destroy(&stack0xffffffffffffffd8);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_set_option_description)
{
    int a = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "b", &a);
    cargo_assert(ret == 0, "Failed to create option");

    ret = cargo_set_option_description(cargo, "--alpha",
            "%s world %d", "hello", 123);
    cargo_assert(ret == 0, "Failed to set description");

    cargo_print_usage(cargo, 0);

    _TEST_CLEANUP();
}